

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawStringDecal
          (PixelGameEngine *this,vf2d *pos,string *sText,Pixel col,vf2d *scale)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  pointer pcVar4;
  short sVar5;
  size_type sVar6;
  float fVar7;
  float fVar8;
  anon_union_4_2_12391da5_for_Pixel_0 local_4c;
  vf2d local_48;
  vf2d local_40;
  vf2d local_38;
  
  sVar3 = sText->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (sText->_M_dataplus)._M_p;
    fVar7 = 0.0;
    sVar6 = 0;
    fVar8 = 0.0;
    local_4c = col.field_0;
    do {
      sVar5 = (short)pcVar4[sVar6];
      if (sVar5 == 10) {
        fVar7 = fVar7 + scale->y * 8.0;
        fVar8 = 0.0;
      }
      else {
        uVar1 = (int)sVar5 - 0x20;
        uVar2 = (int)sVar5 - 0x11;
        if (-1 < (short)uVar1) {
          uVar2 = uVar1;
        }
        local_48.x = pos->x + fVar8;
        local_48.y = pos->y + fVar7;
        local_38.x = (float)(int)(short)((sVar5 - ((ushort)uVar2 & 0xfff0)) + -0x20) * 8.0;
        local_38.y = (float)(int)((long)((ulong)(uVar2 >> 4) << 0x30) >> 0x30) * 8.0;
        local_40.x = 8.0;
        local_40.y = 8.0;
        DrawPartialDecal(this,&local_48,this->fontDecal,&local_38,&local_40,scale,
                         (Pixel *)&local_4c.field_1);
        fVar8 = fVar8 + scale->x * 8.0;
      }
      sVar6 = sVar6 + 1;
    } while (sVar3 != sVar6);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawStringDecal(const olc::vf2d &pos, const std::string &sText, const Pixel col, const olc::vf2d &scale)
	{
		olc::vf2d spos = {0.0f, 0.0f};
		for (auto c : sText)
		{
			if (c == '\n')
			{
				spos.x = 0;
				spos.y += 8.0f * scale.y;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;
				DrawPartialDecal(pos + spos, fontDecal, {float(ox) * 8.0f, float(oy) * 8.0f}, {8.0f, 8.0f}, scale, col);
				spos.x += 8.0f * scale.x;
			}
		}
	}